

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_xfrm.c
# Opt level: O0

void easm_substpos_insn(easm_insn *insn,uint64_t val)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  uint64_t val_local;
  easm_insn *insn_local;
  
  for (local_1c = 0; local_1c < insn->subinsnsnum; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < insn->subinsns[local_1c]->prefsnum; local_20 = local_20 + 1) {
      easm_substpos_expr(insn->subinsns[local_1c]->prefs[local_20],val);
    }
    easm_substpos_sinsn(insn->subinsns[local_1c]->sinsn,val);
  }
  return;
}

Assistant:

void easm_substpos_insn(struct easm_insn *insn, uint64_t val) {
	int i, j;
	for (i = 0; i < insn->subinsnsnum; i++) {
		for (j = 0; j < insn->subinsns[i]->prefsnum; j++)
			easm_substpos_expr(insn->subinsns[i]->prefs[j], val);
		easm_substpos_sinsn(insn->subinsns[i]->sinsn, val);
	}
}